

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O1

CURLcode Curl_sasl_create_digest_http_message
                   (SessionHandle *data,char *userp,char *passwdp,uchar *request,uchar *uripath,
                   digestdata *digest,char **outptr,size_t *outlen)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  CURLcode CVar6;
  uchar *puVar7;
  uchar *puVar8;
  char *pcVar9;
  size_t sVar10;
  int i;
  long lVar11;
  size_t sVar12;
  char *pcVar13;
  uchar md5buf [16];
  char *cnonce;
  size_t cnonce_sz;
  uchar ha1 [33];
  uchar ha2 [33];
  uchar request_digest [33];
  char cnoncebuf [33];
  char *in_stack_fffffffffffffeb8;
  undefined4 uVar14;
  byte local_128 [16];
  uchar *local_118;
  uint local_10c;
  char *local_108;
  uchar *local_100;
  digestdata *local_f8;
  size_t local_f0;
  char local_e8 [48];
  char local_b8 [48];
  char local_88 [48];
  char local_58 [40];
  
  uVar14 = (undefined4)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  local_108 = (char *)0x0;
  local_f0 = 0;
  if (digest->nc == 0) {
    digest->nc = 1;
  }
  local_118 = uripath;
  if (digest->cnonce == (char *)0x0) {
    local_100 = request;
    local_f8 = digest;
    local_10c = Curl_rand(data);
    uVar3 = Curl_rand(data);
    uVar4 = Curl_rand(data);
    uVar5 = Curl_rand(data);
    in_stack_fffffffffffffeb8 = (char *)CONCAT44(uVar14,uVar5);
    curl_msnprintf(local_58,0x21,"%08x%08x%08x%08x",(ulong)local_10c,(ulong)uVar3,(ulong)uVar4,
                   in_stack_fffffffffffffeb8);
    sVar10 = strlen(local_58);
    CVar6 = Curl_base64_encode(data,local_58,sVar10,&local_108,&local_f0);
    if (CVar6 != CURLE_OK) {
      return CVar6;
    }
    local_f8->cnonce = local_108;
    request = local_100;
    digest = local_f8;
  }
  puVar7 = (uchar *)curl_maprintf("%s:%s:%s",userp,digest->realm,passwdp);
  if (puVar7 == (uchar *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  Curl_md5it(local_128,puVar7);
  (*Curl_cfree)(puVar7);
  pcVar13 = local_e8;
  lVar11 = 0;
  do {
    curl_msnprintf(pcVar13,3,"%02x",(ulong)local_128[lVar11]);
    lVar11 = lVar11 + 1;
    pcVar13 = pcVar13 + 2;
  } while (lVar11 != 0x10);
  if (digest->algo == 1) {
    pcVar13 = local_e8;
    puVar7 = (uchar *)curl_maprintf("%s:%s:%s",pcVar13,digest->nonce,digest->cnonce);
    if (puVar7 == (uchar *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    Curl_md5it(local_128,puVar7);
    (*Curl_cfree)(puVar7);
    lVar11 = 0;
    do {
      curl_msnprintf(pcVar13,3,"%02x",(ulong)local_128[lVar11]);
      lVar11 = lVar11 + 1;
      pcVar13 = pcVar13 + 2;
    } while (lVar11 != 0x10);
  }
  puVar7 = (uchar *)curl_maprintf("%s:%s",request,local_118);
  if ((digest->qop != (char *)0x0) && (iVar2 = Curl_raw_equal(digest->qop,"auth-int"), iVar2 != 0))
  {
    puVar8 = (uchar *)curl_maprintf("%s:%s",puVar7,"d41d8cd98f00b204e9800998ecf8427e");
    (*Curl_cfree)(puVar7);
    puVar7 = puVar8;
  }
  if (puVar7 == (uchar *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  Curl_md5it(local_128,puVar7);
  (*Curl_cfree)(puVar7);
  pcVar13 = local_b8;
  lVar11 = 0;
  do {
    curl_msnprintf(pcVar13,3,"%02x",(ulong)local_128[lVar11]);
    lVar11 = lVar11 + 1;
    pcVar13 = pcVar13 + 2;
  } while (lVar11 != 0x10);
  if (digest->qop == (char *)0x0) {
    puVar7 = (uchar *)curl_maprintf("%s:%s:%s",local_e8,digest->nonce,local_b8);
  }
  else {
    in_stack_fffffffffffffeb8 = local_b8;
    puVar7 = (uchar *)curl_maprintf("%s:%s:%08x:%s:%s:%s",local_e8,digest->nonce,
                                    (ulong)(uint)digest->nc,digest->cnonce,digest->qop,
                                    in_stack_fffffffffffffeb8);
  }
  if (puVar7 == (uchar *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  Curl_md5it(local_128,puVar7);
  (*Curl_cfree)(puVar7);
  pcVar13 = local_88;
  lVar11 = 0;
  do {
    curl_msnprintf(pcVar13,3,"%02x",(ulong)local_128[lVar11]);
    uVar14 = (undefined4)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
    lVar11 = lVar11 + 1;
    pcVar13 = pcVar13 + 2;
  } while (lVar11 != 0x10);
  sVar12 = 1;
  pcVar13 = userp;
  do {
    cVar1 = *pcVar13;
    if (cVar1 == '\"') {
LAB_004a7152:
      sVar12 = sVar12 + 2;
    }
    else {
      if (cVar1 == '\0') {
        pcVar9 = (char *)(*Curl_cmalloc)(sVar12);
        pcVar13 = pcVar9;
        if (pcVar9 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        do {
          cVar1 = *userp;
          if ((cVar1 == '\"') || (cVar1 == '\\')) {
            *pcVar13 = '\\';
            pcVar13 = pcVar13 + 1;
          }
          else if (cVar1 == '\0') {
            *pcVar13 = '\0';
            if (pcVar9 == (char *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
            if (digest->qop == (char *)0x0) {
              pcVar13 = curl_maprintf("username=\"%s\", realm=\"%s\", nonce=\"%s\", uri=\"%s\", response=\"%s\""
                                      ,pcVar9,digest->realm,digest->nonce,local_118,local_88);
            }
            else {
              pcVar13 = curl_maprintf("username=\"%s\", realm=\"%s\", nonce=\"%s\", uri=\"%s\", cnonce=\"%s\", nc=%08x, qop=%s, response=\"%s\""
                                      ,pcVar9,digest->realm,digest->nonce,local_118,digest->cnonce,
                                      CONCAT44(uVar14,digest->nc),digest->qop,local_88);
              iVar2 = Curl_raw_equal(digest->qop,"auth");
              if (iVar2 != 0) {
                digest->nc = digest->nc + 1;
              }
            }
            (*Curl_cfree)(pcVar9);
            if (pcVar13 == (char *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
            pcVar9 = pcVar13;
            if (digest->opaque != (char *)0x0) {
              pcVar9 = curl_maprintf("%s, opaque=\"%s\"",pcVar13);
              (*Curl_cfree)(pcVar13);
              if (pcVar9 == (char *)0x0) {
                return CURLE_OUT_OF_MEMORY;
              }
            }
            pcVar13 = pcVar9;
            if (digest->algorithm != (char *)0x0) {
              pcVar13 = curl_maprintf("%s, algorithm=\"%s\"",pcVar9);
              (*Curl_cfree)(pcVar9);
              if (pcVar13 == (char *)0x0) {
                return CURLE_OUT_OF_MEMORY;
              }
            }
            *outptr = pcVar13;
            sVar10 = strlen(pcVar13);
            *outlen = sVar10;
            return CURLE_OK;
          }
          cVar1 = *userp;
          userp = userp + 1;
          *pcVar13 = cVar1;
          pcVar13 = pcVar13 + 1;
        } while( true );
      }
      if (cVar1 == '\\') goto LAB_004a7152;
      sVar12 = sVar12 + 1;
    }
    pcVar13 = pcVar13 + 1;
  } while( true );
}

Assistant:

CURLcode Curl_sasl_create_digest_http_message(struct SessionHandle *data,
                                              const char *userp,
                                              const char *passwdp,
                                              const unsigned char *request,
                                              const unsigned char *uripath,
                                              struct digestdata *digest,
                                              char **outptr, size_t *outlen)
{
  CURLcode result;
  unsigned char md5buf[16]; /* 16 bytes/128 bits */
  unsigned char request_digest[33];
  unsigned char *md5this;
  unsigned char ha1[33];/* 32 digits and 1 zero byte */
  unsigned char ha2[33];/* 32 digits and 1 zero byte */
  char cnoncebuf[33];
  char *cnonce = NULL;
  size_t cnonce_sz = 0;
  char *userp_quoted;
  char *response = NULL;
  char *tmp = NULL;

  if(!digest->nc)
    digest->nc = 1;

  if(!digest->cnonce) {
    snprintf(cnoncebuf, sizeof(cnoncebuf), "%08x%08x%08x%08x",
             Curl_rand(data), Curl_rand(data),
             Curl_rand(data), Curl_rand(data));

    result = Curl_base64_encode(data, cnoncebuf, strlen(cnoncebuf),
                                &cnonce, &cnonce_sz);
    if(result)
      return result;

    digest->cnonce = cnonce;
  }

  /*
    if the algorithm is "MD5" or unspecified (which then defaults to MD5):

    A1 = unq(username-value) ":" unq(realm-value) ":" passwd

    if the algorithm is "MD5-sess" then:

    A1 = H( unq(username-value) ":" unq(realm-value) ":" passwd )
         ":" unq(nonce-value) ":" unq(cnonce-value)
  */

  md5this = (unsigned char *)
    aprintf("%s:%s:%s", userp, digest->realm, passwdp);
  if(!md5this)
    return CURLE_OUT_OF_MEMORY;

  CURL_OUTPUT_DIGEST_CONV(data, md5this); /* convert on non-ASCII machines */
  Curl_md5it(md5buf, md5this);
  free(md5this);
  sasl_digest_md5_to_ascii(md5buf, ha1);

  if(digest->algo == CURLDIGESTALGO_MD5SESS) {
    /* nonce and cnonce are OUTSIDE the hash */
    tmp = aprintf("%s:%s:%s", ha1, digest->nonce, digest->cnonce);
    if(!tmp)
      return CURLE_OUT_OF_MEMORY;

    CURL_OUTPUT_DIGEST_CONV(data, tmp); /* convert on non-ASCII machines */
    Curl_md5it(md5buf, (unsigned char *)tmp);
    free(tmp);
    sasl_digest_md5_to_ascii(md5buf, ha1);
  }

  /*
    If the "qop" directive's value is "auth" or is unspecified, then A2 is:

      A2       = Method ":" digest-uri-value

          If the "qop" value is "auth-int", then A2 is:

      A2       = Method ":" digest-uri-value ":" H(entity-body)

    (The "Method" value is the HTTP request method as specified in section
    5.1.1 of RFC 2616)
  */

  md5this = (unsigned char *)aprintf("%s:%s", request, uripath);

  if(digest->qop && Curl_raw_equal(digest->qop, "auth-int")) {
    /* We don't support auth-int for PUT or POST at the moment.
       TODO: replace md5 of empty string with entity-body for PUT/POST */
    unsigned char *md5this2 = (unsigned char *)
      aprintf("%s:%s", md5this, "d41d8cd98f00b204e9800998ecf8427e");
    free(md5this);
    md5this = md5this2;
  }

  if(!md5this)
    return CURLE_OUT_OF_MEMORY;

  CURL_OUTPUT_DIGEST_CONV(data, md5this); /* convert on non-ASCII machines */
  Curl_md5it(md5buf, md5this);
  free(md5this);
  sasl_digest_md5_to_ascii(md5buf, ha2);

  if(digest->qop) {
    md5this = (unsigned char *)aprintf("%s:%s:%08x:%s:%s:%s",
                                       ha1,
                                       digest->nonce,
                                       digest->nc,
                                       digest->cnonce,
                                       digest->qop,
                                       ha2);
  }
  else {
    md5this = (unsigned char *)aprintf("%s:%s:%s",
                                       ha1,
                                       digest->nonce,
                                       ha2);
  }

  if(!md5this)
    return CURLE_OUT_OF_MEMORY;

  CURL_OUTPUT_DIGEST_CONV(data, md5this); /* convert on non-ASCII machines */
  Curl_md5it(md5buf, md5this);
  free(md5this);
  sasl_digest_md5_to_ascii(md5buf, request_digest);

  /* for test case 64 (snooped from a Mozilla 1.3a request)

    Authorization: Digest username="testuser", realm="testrealm", \
    nonce="1053604145", uri="/64", response="c55f7f30d83d774a3d2dcacf725abaca"

    Digest parameters are all quoted strings.  Username which is provided by
    the user will need double quotes and backslashes within it escaped.  For
    the other fields, this shouldn't be an issue.  realm, nonce, and opaque
    are copied as is from the server, escapes and all.  cnonce is generated
    with web-safe characters.  uri is already percent encoded.  nc is 8 hex
    characters.  algorithm and qop with standard values only contain web-safe
    chracters.
  */
  userp_quoted = sasl_digest_string_quoted(userp);
  if(!userp_quoted)
    return CURLE_OUT_OF_MEMORY;

  if(digest->qop) {
    response = aprintf("username=\"%s\", "
                       "realm=\"%s\", "
                       "nonce=\"%s\", "
                       "uri=\"%s\", "
                       "cnonce=\"%s\", "
                       "nc=%08x, "
                       "qop=%s, "
                       "response=\"%s\"",
                       userp_quoted,
                       digest->realm,
                       digest->nonce,
                       uripath,
                       digest->cnonce,
                       digest->nc,
                       digest->qop,
                       request_digest);

    if(Curl_raw_equal(digest->qop, "auth"))
      digest->nc++; /* The nc (from RFC) has to be a 8 hex digit number 0
                       padded which tells to the server how many times you are
                       using the same nonce in the qop=auth mode */
  }
  else {
    response = aprintf("username=\"%s\", "
                       "realm=\"%s\", "
                       "nonce=\"%s\", "
                       "uri=\"%s\", "
                       "response=\"%s\"",
                       userp_quoted,
                       digest->realm,
                       digest->nonce,
                       uripath,
                       request_digest);
  }
  free(userp_quoted);
  if(!response)
    return CURLE_OUT_OF_MEMORY;

  /* Add the optional fields */
  if(digest->opaque) {
    /* Append the opaque */
    tmp = aprintf("%s, opaque=\"%s\"", response, digest->opaque);
    free(response);
    if(!tmp)
      return CURLE_OUT_OF_MEMORY;

    response = tmp;
  }

  if(digest->algorithm) {
    /* Append the algorithm */
    tmp = aprintf("%s, algorithm=\"%s\"", response, digest->algorithm);
    free(response);
    if(!tmp)
      return CURLE_OUT_OF_MEMORY;

    response = tmp;
  }

  /* Return the output */
  *outptr = response;
  *outlen = strlen(response);

  return CURLE_OK;
}